

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O2

void __thiscall CMakeScanner::SetInputFile(CMakeScanner *this,string *path)

{
  FILE *pFVar1;
  runtime_error *this_00;
  allocator<char> local_61;
  string error;
  string local_40;
  
  pFVar1 = fopen((path->_M_dataplus)._M_p,"rb");
  this->file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    std::__cxx11::string::string((string *)&local_40,(string *)path);
    ScannerCtx::SetInputFile(&this->scannerCtx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    yyset_in(this->file,this->yyscanner);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&error,"Cannot open file ",&local_61)
  ;
  std::__cxx11::string::append((string *)&error);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&error);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetInputFile(const std::string& path)
    {
        file = fopen(path.c_str(), "rb");
        if(!file)
        {
            std::string error{"Cannot open file "};
            error += path;
            throw std::runtime_error{error};
        }
        scannerCtx.SetInputFile(path);
        yyset_in(file, yyscanner);
    }